

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O1

void __thiscall icu_63::DateFormatSymbols::initZoneStringsArray(DateFormatSymbols *this)

{
  int iVar1;
  undefined4 extraout_var;
  UnicodeString *pUVar2;
  undefined8 *puVar3;
  UnicodeString *this_00;
  long lVar4;
  ulong uVar5;
  UErrorCode *ec;
  UnicodeString **__s;
  ulong uVar6;
  long lVar7;
  UErrorCode status;
  UnicodeString tzDispName;
  UErrorCode local_9c;
  ulong local_98;
  TimeZoneNames *local_90;
  DateFormatSymbols *local_88;
  StringEnumeration *local_80;
  UDate local_78;
  UnicodeString local_70;
  undefined4 extraout_var_00;
  
  if ((this->fZoneStrings == (UnicodeString **)0x0) &&
     (this->fLocaleZoneStrings == (UnicodeString **)0x0)) {
    ec = &local_9c;
    local_9c = U_ZERO_ERROR;
    local_90 = (TimeZoneNames *)0x0;
    local_88 = this;
    local_80 = TimeZone::createTimeZoneIDEnumeration
                         (UCAL_ZONE_TYPE_ANY,(char *)0x0,(int32_t *)0x0,ec);
    iVar1 = (*(local_80->super_UObject)._vptr_UObject[4])();
    local_98 = CONCAT44(extraout_var,iVar1);
    __s = (UnicodeString **)0x0;
    if (local_9c < U_ILLEGAL_ARGUMENT_ERROR) {
      __s = (UnicodeString **)uprv_malloc_63((long)(iVar1 * 8));
      if (__s == (UnicodeString **)0x0) {
        local_9c = U_MEMORY_ALLOCATION_ERROR;
        local_90 = (TimeZoneNames *)0x0;
      }
      else {
        memset(__s,0,(long)(iVar1 * 8));
        ec = &local_9c;
        local_90 = TimeZoneNames::createInstance(&local_88->fZSFLocale,ec);
        (*(local_90->super_UObject)._vptr_UObject[0xd])();
        if (local_9c < U_ILLEGAL_ARGUMENT_ERROR) {
          local_78 = Calendar::getNow();
          local_70.super_Replaceable.super_UObject._vptr_UObject =
               (UObject)&PTR__UnicodeString_0048be70;
          local_70.fUnion.fStackFields.fLengthAndFlags = 2;
          lVar7 = 0;
          while( true ) {
            ec = &local_9c;
            iVar1 = (*(local_80->super_UObject)._vptr_UObject[7])();
            pUVar2 = (UnicodeString *)CONCAT44(extraout_var_00,iVar1);
            if ((pUVar2 == (UnicodeString *)0x0) || (U_ZERO_ERROR < local_9c)) goto LAB_002e595b;
            puVar3 = (undefined8 *)UMemory::operator_new__((UMemory *)0x148,(size_t)ec);
            if (puVar3 == (undefined8 *)0x0) {
              this_00 = (UnicodeString *)0x0;
            }
            else {
              *puVar3 = 5;
              lVar4 = 0x10;
              do {
                *(undefined ***)((long)puVar3 + lVar4 + -8) = &PTR__UnicodeString_0048be70;
                *(undefined2 *)((long)puVar3 + lVar4) = 2;
                lVar4 = lVar4 + 0x40;
              } while (lVar4 != 0x150);
              this_00 = (UnicodeString *)(puVar3 + 1);
            }
            __s[lVar7] = this_00;
            if (this_00 == (UnicodeString *)0x0) break;
            icu_63::UnicodeString::copyFrom(this_00,pUVar2,'\0');
            (*(local_90->super_UObject)._vptr_UObject[0xe])
                      (local_78,local_90,pUVar2,initZoneStringsArray::TYPES,4,__s[lVar7] + 1,
                       &local_9c);
            lVar7 = lVar7 + 1;
          }
          local_9c = U_MEMORY_ALLOCATION_ERROR;
LAB_002e595b:
          icu_63::UnicodeString::~UnicodeString(&local_70);
        }
      }
    }
    if ((__s != (UnicodeString **)0x0) && (U_ZERO_ERROR < local_9c)) {
      if (0 < (int)local_98) {
        uVar6 = local_98 & 0xffffffff;
        uVar5 = 0;
        do {
          pUVar2 = __s[uVar5];
          if (pUVar2 != (UnicodeString *)0x0) {
            lVar7 = *(long *)((long)&pUVar2[-1].fUnion + 0x30);
            if (lVar7 != 0) {
              lVar7 = lVar7 << 6;
              do {
                icu_63::UnicodeString::~UnicodeString
                          ((UnicodeString *)
                           ((long)&pUVar2[-1].super_Replaceable.super_UObject._vptr_UObject + lVar7)
                          );
                lVar7 = lVar7 + -0x40;
              } while (lVar7 != 0);
            }
            UMemory::operator_delete__((UMemory *)((long)&pUVar2[-1].fUnion + 0x30),ec);
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != uVar6);
      }
      uprv_free_63(__s);
      __s = (UnicodeString **)0x0;
    }
    if (local_90 != (TimeZoneNames *)0x0) {
      (*(local_90->super_UObject)._vptr_UObject[1])();
    }
    (*(local_80->super_UObject)._vptr_UObject[1])();
    local_88->fLocaleZoneStrings = __s;
    local_88->fZoneStringsRowCount = (int32_t)local_98;
    local_88->fZoneStringsColCount = 5;
  }
  return;
}

Assistant:

void
DateFormatSymbols::initZoneStringsArray(void) {
    if (fZoneStrings != NULL || fLocaleZoneStrings != NULL) {
        return;
    }

    UErrorCode status = U_ZERO_ERROR;

    StringEnumeration *tzids = NULL;
    UnicodeString ** zarray = NULL;
    TimeZoneNames *tzNames = NULL;
    int32_t rows = 0;

    static const UTimeZoneNameType TYPES[] = {
        UTZNM_LONG_STANDARD, UTZNM_SHORT_STANDARD,
        UTZNM_LONG_DAYLIGHT, UTZNM_SHORT_DAYLIGHT
    };
    static const int32_t NUM_TYPES = 4;

    do { // dummy do-while

        tzids = TimeZone::createTimeZoneIDEnumeration(ZONE_SET, NULL, NULL, status);
        rows = tzids->count(status);
        if (U_FAILURE(status)) {
            break;
        }

        // Allocate array
        int32_t size = rows * sizeof(UnicodeString*);
        zarray = (UnicodeString**)uprv_malloc(size);
        if (zarray == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            break;
        }
        uprv_memset(zarray, 0, size);

        tzNames = TimeZoneNames::createInstance(fZSFLocale, status);
        tzNames->loadAllDisplayNames(status);
        if (U_FAILURE(status)) { break; }

        const UnicodeString *tzid;
        int32_t i = 0;
        UDate now = Calendar::getNow();
        UnicodeString tzDispName;

        while ((tzid = tzids->snext(status)) != 0) {
            if (U_FAILURE(status)) {
                break;
            }

            zarray[i] = new UnicodeString[5];
            if (zarray[i] == NULL) {
                status = U_MEMORY_ALLOCATION_ERROR;
                break;
            }

            zarray[i][0].setTo(*tzid);
            tzNames->getDisplayNames(*tzid, TYPES, NUM_TYPES, now, zarray[i]+1, status);
            i++;
        }

    } while (FALSE);

    if (U_FAILURE(status)) {
        if (zarray) {
            for (int32_t i = 0; i < rows; i++) {
                if (zarray[i]) {
                    delete[] zarray[i];
                }
            }
            uprv_free(zarray);
            zarray = NULL;
        }
    }

    if (tzNames) {
        delete tzNames;
    }
    if (tzids) {
        delete tzids;
    }

    fLocaleZoneStrings = zarray;
    fZoneStringsRowCount = rows;
    fZoneStringsColCount = 1 + NUM_TYPES;
}